

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  Comparator *pCVar1;
  char *pcVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t bnum;
  uint64_t anum;
  Slice local_38;
  int local_24;
  Slice *pSStack_20;
  int r;
  Slice *bkey_local;
  Slice *akey_local;
  InternalKeyComparator *this_local;
  
  pCVar1 = this->user_comparator_;
  pSStack_20 = bkey;
  bkey_local = akey;
  akey_local = (Slice *)this;
  local_38 = ExtractUserKey(akey);
  _anum = ExtractUserKey(pSStack_20);
  local_24 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_38,&anum);
  if (local_24 == 0) {
    pcVar2 = Slice::data(bkey_local);
    sVar3 = Slice::size(bkey_local);
    uVar4 = DecodeFixed64(pcVar2 + (sVar3 - 8));
    pcVar2 = Slice::data(pSStack_20);
    sVar3 = Slice::size(pSStack_20);
    uVar5 = DecodeFixed64(pcVar2 + (sVar3 - 8));
    if (uVar5 < uVar4) {
      local_24 = -1;
    }
    else if (uVar4 < uVar5) {
      local_24 = 1;
    }
  }
  return local_24;
}

Assistant:

int InternalKeyComparator::Compare(const Slice& akey, const Slice& bkey) const {
  // Order by:
  //    increasing user key (according to user-supplied comparator)
  //    decreasing sequence number
  //    decreasing type (though sequence# should be enough to disambiguate)
  int r = user_comparator_->Compare(ExtractUserKey(akey), ExtractUserKey(bkey));
  if (r == 0) {
    const uint64_t anum = DecodeFixed64(akey.data() + akey.size() - 8);
    const uint64_t bnum = DecodeFixed64(bkey.data() + bkey.size() - 8);
    if (anum > bnum) {
      r = -1;
    } else if (anum < bnum) {
      r = +1;
    }
  }
  return r;
}